

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void icetGetIntegerv(IceTEnum pname,IceTInt *params)

{
  ulong uVar1;
  IceTEnum type;
  IceTState pIVar2;
  long lVar3;
  char msg [256];
  
  uVar1 = (ulong)pname;
  pIVar2 = icetGetState();
  switch(pIVar2[uVar1].type) {
  case 0x8000:
    for (lVar3 = 0; lVar3 < pIVar2[uVar1].num_entries; lVar3 = lVar3 + 1) {
      params[lVar3] = (uint)*(byte *)((long)pIVar2[uVar1].data + lVar3);
    }
    break;
  case 0x8001:
  case 0x8002:
switchD_00109f34_caseD_8001:
    sprintf(msg,"Could not cast value for 0x%x.",uVar1);
    type = 0xfffffffd;
    goto LAB_00109f95;
  case 0x8003:
    for (lVar3 = 0; lVar3 < pIVar2[uVar1].num_entries; lVar3 = lVar3 + 1) {
      params[lVar3] = *(IceTInt *)((long)pIVar2[uVar1].data + lVar3 * 4);
    }
    break;
  case 0x8004:
    for (lVar3 = 0; lVar3 < pIVar2[uVar1].num_entries; lVar3 = lVar3 + 1) {
      params[lVar3] = (int)*(float *)((long)pIVar2[uVar1].data + lVar3 * 4);
    }
    break;
  case 0x8005:
    for (lVar3 = 0; lVar3 < pIVar2[uVar1].num_entries; lVar3 = lVar3 + 1) {
      params[lVar3] = (int)*(double *)((long)pIVar2[uVar1].data + lVar3 * 8);
    }
    break;
  default:
    if (pIVar2[uVar1].type != 0) goto switchD_00109f34_caseD_8001;
    sprintf(msg,"No such parameter, 0x%x.",uVar1);
    type = 0xfffffffe;
LAB_00109f95:
    icetRaiseDiagnostic(msg,type,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x15e);
  }
  return;
}

Assistant:

void icetGetIntegerv(IceTEnum pname, IceTInt *params)
{
    struct IceTStateValue *value = icetGetState() + pname;
    int i;
    stateCheck(pname, icetGetState());
    copyArray(IceTInt, params, value->type, value->data, value->num_entries);
}